

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void iadst16_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i alVar5;
  undefined1 auVar6 [32];
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  undefined1 auVar12 [32];
  int iVar13;
  int iVar14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  __m256i alVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  
  lVar15 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x168);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar16._16_4_ = uVar1;
  auVar16._20_4_ = uVar1;
  auVar16._24_4_ = uVar1;
  auVar16._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 600);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar17._16_4_ = uVar1;
  auVar17._20_4_ = uVar1;
  auVar17._24_4_ = uVar1;
  auVar17._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x180);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18._16_4_ = uVar1;
  auVar18._20_4_ = uVar1;
  auVar18._24_4_ = uVar1;
  auVar18._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x240);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x220);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x1a0);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar19._16_4_ = uVar1;
  auVar19._20_4_ = uVar1;
  auVar19._24_4_ = uVar1;
  auVar19._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x1e0);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  iVar14 = 1 << ((char)bit - 1U & 0x1f);
  auVar22._4_4_ = iVar14;
  auVar22._0_4_ = iVar14;
  auVar22._8_4_ = iVar14;
  auVar22._12_4_ = iVar14;
  auVar22._16_4_ = iVar14;
  auVar22._20_4_ = iVar14;
  auVar22._24_4_ = iVar14;
  auVar22._28_4_ = iVar14;
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar17);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  alVar2 = (__m256i)vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar16);
  auVar17 = vpsubd_avx2(auVar22,auVar17);
  auVar3 = vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar18);
  auVar16 = vpmulld_avx2(auVar3,auVar26);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar17 = vpaddd_avx2(auVar16,auVar17);
  auVar20 = ZEXT416((uint)bit);
  auVar4 = vpsrad_avx2(auVar17,auVar20);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar26);
  auVar16 = vpmulld_avx2(auVar18,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar17 = vpsubd_avx2(auVar17,auVar16);
  alVar5 = (__m256i)vpsrad_avx2(auVar17,auVar20);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar19);
  auVar16 = vpmulld_avx2(auVar3,auVar24);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar17 = vpaddd_avx2(auVar16,auVar17);
  auVar6 = vpsrad_avx2(auVar17,auVar20);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar24);
  auVar16 = vpmulld_avx2(auVar19,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar17 = vpsubd_avx2(auVar17,auVar16);
  alVar7 = (__m256i)vpsrad_avx2(auVar17,auVar20);
  auVar17 = vpmulld_avx2(auVar4,auVar19);
  auVar16 = vpmulld_avx2((undefined1  [32])alVar5,auVar24);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar17 = vpaddd_avx2(auVar17,auVar16);
  auVar16 = vpmulld_avx2(auVar4,auVar24);
  auVar18 = vpmulld_avx2(auVar19,(undefined1  [32])alVar5);
  auVar16 = vpaddd_avx2(auVar16,auVar22);
  auVar12 = vpsubd_avx2(auVar16,auVar18);
  auVar16 = vpmulld_avx2((undefined1  [32])alVar2,auVar23);
  auVar24 = vpmulld_avx2(auVar3,auVar23);
  auVar16 = vpaddd_avx2(auVar16,auVar22);
  auVar18 = vpaddd_avx2(auVar24,auVar16);
  auVar25 = vpsubd_avx2(auVar16,auVar24);
  auVar16 = vpmulld_avx2(auVar6,auVar23);
  auVar19 = vpmulld_avx2((undefined1  [32])alVar7,auVar23);
  auVar16 = vpaddd_avx2(auVar16,auVar22);
  auVar24 = vpaddd_avx2(auVar16,auVar19);
  auVar27 = vpsubd_avx2(auVar16,auVar19);
  auVar16 = vpmulld_avx2(auVar4,auVar23);
  auVar16 = vpaddd_avx2(auVar16,auVar22);
  auVar26 = vpmulld_avx2((undefined1  [32])alVar5,auVar23);
  auVar19 = vpaddd_avx2(auVar16,auVar26);
  auVar28 = vpsubd_avx2(auVar16,auVar26);
  auVar20 = ZEXT416((uint)bit);
  alVar8 = (__m256i)vpsrad_avx2(auVar17,auVar20);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar8,auVar23);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar12 = vpsrad_avx2(auVar12,auVar20);
  auVar26 = vpmulld_avx2(auVar12,auVar23);
  auVar16 = vpaddd_avx2(auVar17,auVar26);
  auVar26 = vpsubd_avx2(auVar17,auVar26);
  auVar17 = vpsrad_avx2(auVar18,auVar20);
  alVar9 = (__m256i)vpsrad_avx2(auVar25,auVar20);
  alVar10 = (__m256i)vpsrad_avx2(auVar24,auVar20);
  auVar18 = vpsrad_avx2(auVar27,auVar20);
  alVar11 = (__m256i)vpsrad_avx2(auVar19,auVar20);
  auVar24 = vpsrad_avx2(auVar28,auVar20);
  auVar16 = vpsrad_avx2(auVar16,ZEXT416((uint)bit));
  alVar21 = (__m256i)vpsrad_avx2(auVar26,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar14 = 10;
    if (10 < bd) {
      iVar14 = bd;
    }
    iVar14 = 0x20 << ((byte)iVar14 & 0x1f);
    iVar13 = -iVar14;
    auVar25._4_4_ = iVar13;
    auVar25._0_4_ = iVar13;
    auVar25._8_4_ = iVar13;
    auVar25._12_4_ = iVar13;
    auVar25._16_4_ = iVar13;
    auVar25._20_4_ = iVar13;
    auVar25._24_4_ = iVar13;
    auVar25._28_4_ = iVar13;
    iVar14 = iVar14 + -1;
    iVar13 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar28._4_4_ = iVar13;
    auVar28._0_4_ = iVar13;
    auVar28._8_4_ = iVar13;
    auVar28._12_4_ = iVar13;
    auVar28._16_4_ = iVar13;
    auVar28._20_4_ = iVar13;
    auVar28._24_4_ = iVar13;
    auVar28._28_4_ = iVar13;
    auVar19 = vpaddd_avx2((undefined1  [32])alVar2,auVar28);
    auVar19 = vpsrad_avx2(auVar19,ZEXT416((uint)out_shift));
    auVar27._4_4_ = iVar14;
    auVar27._0_4_ = iVar14;
    auVar27._8_4_ = iVar14;
    auVar27._12_4_ = iVar14;
    auVar27._16_4_ = iVar14;
    auVar27._20_4_ = iVar14;
    auVar27._24_4_ = iVar14;
    auVar27._28_4_ = iVar14;
    auVar19 = vpmaxsd_avx2(auVar19,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    *out = alVar2;
    auVar19 = vpsubd_avx2(auVar28,auVar4);
    auVar19 = vpsrad_avx2(auVar19,ZEXT416((uint)out_shift));
    auVar19 = vpmaxsd_avx2(auVar19,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    auVar19 = vpaddd_avx2((undefined1  [32])alVar8,auVar28);
    auVar20 = ZEXT416((uint)out_shift);
    auVar19 = vpsrad_avx2(auVar19,auVar20);
    out[1] = alVar2;
    auVar19 = vpmaxsd_avx2(auVar19,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    out[2] = alVar2;
    auVar19 = vpsubd_avx2(auVar28,auVar6);
    auVar19 = vpsrad_avx2(auVar19,auVar20);
    auVar19 = vpmaxsd_avx2(auVar19,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    auVar19 = vpaddd_avx2(auVar28,(undefined1  [32])alVar10);
    auVar19 = vpsrad_avx2(auVar19,auVar20);
    out[3] = alVar2;
    auVar19 = vpmaxsd_avx2(auVar19,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    out[4] = alVar2;
    auVar16 = vpsubd_avx2(auVar28,auVar16);
    auVar16 = vpsrad_avx2(auVar16,auVar20);
    auVar16 = vpmaxsd_avx2(auVar16,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar16,auVar27);
    auVar16 = vpaddd_avx2((undefined1  [32])alVar11,auVar28);
    auVar20 = ZEXT416((uint)out_shift);
    auVar16 = vpsrad_avx2(auVar16,auVar20);
    out[5] = alVar2;
    auVar16 = vpmaxsd_avx2(auVar16,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar16,auVar27);
    out[6] = alVar2;
    auVar17 = vpsubd_avx2(auVar28,auVar17);
    auVar17 = vpsrad_avx2(auVar17,auVar20);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar27);
    auVar17 = vpaddd_avx2((undefined1  [32])alVar9,auVar28);
    auVar17 = vpsrad_avx2(auVar17,auVar20);
    out[7] = alVar2;
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar27);
    out[8] = alVar2;
    auVar17 = vpsubd_avx2(auVar28,auVar24);
    auVar17 = vpsrad_avx2(auVar17,auVar20);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar27);
    out[9] = alVar2;
    auVar17 = vpaddd_avx2(auVar28,(undefined1  [32])alVar21);
    auVar24 = vpsubd_avx2(auVar28,auVar18);
    auVar16 = vpaddd_avx2(auVar28,(undefined1  [32])alVar7);
    auVar26 = vpsubd_avx2(auVar28,auVar12);
    auVar18 = vpaddd_avx2(auVar28,(undefined1  [32])alVar5);
    auVar4 = vpsubd_avx2(auVar28,auVar3);
    auVar17 = vpsrad_avx2(auVar17,auVar20);
    auVar24 = vpsrad_avx2(auVar24,auVar20);
    auVar19 = vpsrad_avx2(auVar16,auVar20);
    auVar26 = vpsrad_avx2(auVar26,auVar20);
    auVar3 = vpsrad_avx2(auVar18,ZEXT416((uint)out_shift));
    auVar4 = vpsrad_avx2(auVar4,ZEXT416((uint)out_shift));
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    auVar16 = vpmaxsd_avx2(auVar24,auVar25);
    auVar18 = vpmaxsd_avx2(auVar19,auVar25);
    auVar24 = vpmaxsd_avx2(auVar26,auVar25);
    auVar19 = vpmaxsd_avx2(auVar3,auVar25);
    auVar26 = vpmaxsd_avx2(auVar4,auVar25);
    alVar21 = (__m256i)vpminsd_avx2(auVar17,auVar27);
    alVar2 = (__m256i)vpminsd_avx2(auVar16,auVar27);
    alVar7 = (__m256i)vpminsd_avx2(auVar18,auVar27);
    alVar8 = (__m256i)vpminsd_avx2(auVar24,auVar27);
    alVar5 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    alVar9 = (__m256i)vpminsd_avx2(auVar26,auVar27);
  }
  else {
    *out = alVar2;
    auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar4);
    out[1] = alVar2;
    out[2] = alVar8;
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar6);
    out[3] = alVar2;
    out[4] = alVar10;
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar16);
    out[5] = alVar2;
    out[6] = alVar11;
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar17);
    out[7] = alVar2;
    out[8] = alVar9;
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar24);
    out[9] = alVar2;
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar18);
    alVar8 = (__m256i)vpsubd_avx2(auVar19,auVar12);
    alVar9 = (__m256i)vpsubd_avx2(auVar19,auVar3);
  }
  out[10] = alVar21;
  out[0xb] = alVar2;
  out[0xc] = alVar7;
  out[0xd] = alVar8;
  out[0xe] = alVar5;
  out[0xf] = alVar9;
  return;
}

Assistant:

static void iadst16_low1_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  const __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  const __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);
  const __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);

  // stage 1
  __m256i x1[16];
  x1[1] = input[0];

  // stage 2
  btf_16_w16_0_avx2(cospi[62], -cospi[2], x1[1], x1[0], x1[1]);

  // stage 3
  x1[8] = x1[0];
  x1[9] = x1[1];

  // stage 4
  btf_16_w16_avx2(cospi_p08_p56, cospi_p56_m08, &x1[8], &x1[9], _r,
                  INV_COS_BIT);

  // stage 5
  x1[4] = x1[0];
  x1[5] = x1[1];

  x1[12] = x1[8];
  x1[13] = x1[9];

  // stage 6
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[4], &x1[5], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x1[12], &x1[13], _r,
                  INV_COS_BIT);

  // stage 7
  x1[2] = x1[0];
  x1[3] = x1[1];
  x1[6] = x1[4];
  x1[7] = x1[5];
  x1[10] = x1[8];
  x1[11] = x1[9];
  x1[14] = x1[12];
  x1[15] = x1[13];

  iadst16_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage9_avx2(output, x1);
}